

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O0

void store_pack_float80(uint32 ea,int k,floatx80 fpr)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  floatx80 fx;
  uint local_cc;
  uint local_c8;
  int exp;
  int j;
  int i;
  char *ch;
  char str [128];
  uint local_2c;
  uint local_28;
  uint32 dw3;
  uint32 dw2;
  uint32 dw1;
  int k_local;
  uint32 ea_local;
  floatx80 fpr_local;
  
  local_2c = 0;
  local_28 = 0;
  dw3 = 0;
  _j = &ch;
  fx._2_6_ = 0;
  fx.high = fpr.high;
  fx.low = fpr.low;
  fx80_to_double(fx);
  sprintf((char *)&ch,"%.16e");
  if ((char)ch == '-') {
    _j = (char **)((long)&ch + 1);
    dw3 = 0x80000000;
  }
  if (*(char *)_j == '+') {
    _j = (char **)((long)_j + 1);
  }
  dw3 = (int)*(char *)_j - 0x30U | dw3;
  pcVar3 = (char *)((long)_j + 1);
  if (*(char *)((long)_j + 1) == '.') {
    pcVar3 = (char *)((long)_j + 2);
  }
  _j = (char **)pcVar3;
  dw2 = k;
  if ((k < 1) && (-0xe < k)) {
    local_cc = 0;
    for (exp = 0; exp < 3; exp = exp + 1) {
      if (('/' < *(char *)((long)_j + (long)(exp + 0x12))) &&
         (*(char *)((long)_j + (long)(exp + 0x12)) < ':')) {
        local_cc = local_cc << 4 | (int)*(char *)((long)_j + (long)(exp + 0x12)) - 0x30U;
      }
    }
    if (*(char *)((long)_j + 0x11) == '-') {
      local_cc = -local_cc;
    }
    local_c8 = (local_cc - 1) - k;
    if ('4' < *(char *)((long)_j + (long)(int)(local_c8 + 1))) {
      *(char *)((long)_j + (long)(int)local_c8) = *(char *)((long)_j + (long)(int)local_c8) + '\x01'
      ;
    }
    while (local_c8 = local_c8 + 1, (int)local_c8 < 0x10) {
      *(char *)((long)_j + (long)(int)local_c8) = '0';
    }
    dw2 = 0;
  }
  for (exp = 0; exp < 8; exp = exp + 1) {
    local_28 = local_28 << 4;
    if (('/' < *(char *)_j) && (*(char *)_j < ':')) {
      local_28 = (int)*(char *)_j - 0x30U | local_28;
      _j = (char **)((long)_j + 1);
    }
  }
  for (exp = 0; exp < 8; exp = exp + 1) {
    local_2c = local_2c << 4;
    if (('/' < *(char *)_j) && (*(char *)_j < ':')) {
      local_2c = (int)*(char *)_j - 0x30U | local_2c;
      _j = (char **)((long)_j + 1);
    }
  }
  if (0 < (int)dw2) {
    uVar1 = pkmask3[0x11];
    uVar2 = pkmask2[0x11];
    if ((int)dw2 < 0x12) {
      uVar1 = pkmask3[(int)dw2];
      uVar2 = pkmask2[(int)dw2];
    }
    local_28 = uVar2 & local_28;
    local_2c = uVar1 & local_2c;
  }
  if ((*(char *)_j == 'e') || (*(char *)_j == 'E')) {
    pcVar3 = (char *)((long)_j + 1);
    if (*(char *)((long)_j + 1) == '-') {
      dw3 = dw3 | 0x40000000;
      pcVar3 = (char *)((long)_j + 2);
    }
    _j = (char **)pcVar3;
    if (*(char *)_j == '+') {
      _j = (char **)((long)_j + 1);
    }
    local_c8 = 0;
    for (exp = 0; exp < 3; exp = exp + 1) {
      if (('/' < *(char *)_j) && (*(char *)_j < ':')) {
        local_c8 = local_c8 << 4 | (int)*(char *)_j - 0x30U;
        _j = (char **)((long)_j + 1);
      }
    }
    dw3 = local_c8 << 0x10 | dw3;
  }
  m68ki_write_32_fc(ea,m68ki_cpu.s_flag | 1,dw3);
  m68ki_write_32_fc(ea + 4,m68ki_cpu.s_flag | 1,local_28);
  m68ki_write_32_fc(ea + 8,m68ki_cpu.s_flag | 1,local_2c);
  return;
}

Assistant:

static inline void store_pack_float80(uint32 ea, int k, floatx80 fpr)
{
	uint32 dw1, dw2, dw3;
	char str[128], *ch;
	int i, j, exp;

	dw1 = dw2 = dw3 = 0;
	ch = &str[0];

	sprintf(str, "%.16e", fx80_to_double(fpr));

	if (*ch == '-')
	{
		ch++;
		dw1 = 0x80000000;
	}

	if (*ch == '+')
	{
		ch++;
	}

	dw1 |= (*ch++ - '0');

	if (*ch == '.')
	{
		ch++;
	}

	// handle negative k-factor here
	if ((k <= 0) && (k >= -13))
	{
		exp = 0;
		for (i = 0; i < 3; i++)
		{
			if (ch[18+i] >= '0' && ch[18+i] <= '9')
			{
				exp = (exp << 4) | (ch[18+i] - '0');
			}
		}

		if (ch[17] == '-')
		{
			exp = -exp;
		}

		k = -k;
		// last digit is (k + exponent - 1)
		k += (exp - 1);

		// round up the last significant mantissa digit
		if (ch[k+1] >= '5')
		{
			ch[k]++;
		}

		// zero out the rest of the mantissa digits
		for (j = (k+1); j < 16; j++)
		{
			ch[j] = '0';
		}

		// now zero out K to avoid tripping the positive K detection below
		k = 0;
	}

	// crack 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw2 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		{
			dw2 |= *ch++ - '0';
		}
	}

	// next 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw3 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		dw3 |= *ch++ - '0';
	}

	// handle masking if k is positive
	if (k >= 1)
	{
		if (k <= 17)
		{
			dw2 &= pkmask2[k];
			dw3 &= pkmask3[k];
		}
		else
		{
			dw2 &= pkmask2[17];
			dw3 &= pkmask3[17];
//			m68ki_cpu.fpcr |=  (need to set OPERR bit)
		}
	}

	// finally, crack the exponent
	if (*ch == 'e' || *ch == 'E')
	{
		ch++;
		if (*ch == '-')
		{
			ch++;
			dw1 |= 0x40000000;
		}

		if (*ch == '+')
		{
			ch++;
		}

		j = 0;
		for (i = 0; i < 3; i++)
		{
			if (*ch >= '0' && *ch <= '9')
			{
				j = (j << 4) | (*ch++ - '0');
			}
		}

		dw1 |= (j << 16);
	}

	m68ki_write_32(ea, dw1);
	m68ki_write_32(ea+4, dw2);
	m68ki_write_32(ea+8, dw3);
}